

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O0

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createDynamicMemAlloc
          (LLVMPointerGraphBuilder *this,CallInst *CInst,AllocationFunction type)

{
  PSNode *l;
  int in_ECX;
  PSNodesSeq *in_RDI;
  PSNodesSeq *seq;
  PSNodesSeq *in_stack_ffffffffffffff68;
  PSNodesSeq *this_00;
  pointer in_stack_ffffffffffffff90;
  AllocationFunction type_00;
  CallInst *in_stack_ffffffffffffff98;
  PSNode *in_stack_ffffffffffffffa0;
  CallInst *in_stack_ffffffffffffffb0;
  LLVMPointerGraphBuilder *in_stack_ffffffffffffffb8;
  
  type_00 = (AllocationFunction)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  this_00 = in_RDI;
  PSNodesSeq::PSNodesSeq(in_RDI);
  if (in_ECX == 4) {
    createRealloc(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    PSNodesSeq::operator=(this_00,in_stack_ffffffffffffff68);
    PSNodesSeq::~PSNodesSeq((PSNodesSeq *)0x1bad5e);
  }
  else {
    l = createDynamicAlloc((LLVMPointerGraphBuilder *)in_stack_ffffffffffffffa0,
                           in_stack_ffffffffffffff98,type_00);
    PSNodesSeq::PSNodesSeq
              ((PSNodesSeq *)&stack0xffffffffffffff88,(initializer_list<dg::pta::PSNode_*> *)l);
    PSNodesSeq::operator=(this_00,in_stack_ffffffffffffff68);
    PSNodesSeq::~PSNodesSeq((PSNodesSeq *)0x1badb6);
  }
  return in_RDI;
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq
LLVMPointerGraphBuilder::createDynamicMemAlloc(const llvm::CallInst *CInst,
                                               AllocationFunction type) {
    assert(type != AllocationFunction::NONE &&
           "BUG: creating dyn. memory node for NONMEM");

    PSNodesSeq seq;
    if (type == AllocationFunction::REALLOC) {
        seq = createRealloc(CInst);
    } else {
        seq = {createDynamicAlloc(CInst, type)};
    }
    return seq;
}